

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *
kj::parse::
Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
::
Impl<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
::apply(Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
        *__return_storage_ptr__,
       ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
       *subParser,
       IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *input)

{
  bool bVar1;
  Results results;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  subInput;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> _subResult425;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_d8;
  undefined1 local_b8 [24];
  Reader *local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  uint uStack_88;
  undefined4 uStack_84;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_80;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_58;
  
  local_d8.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_d8.pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *
                 )0x0;
  local_d8.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_d8.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  do {
    if ((input->pos).index == (input->end).index) break;
    local_b8._8_8_ = (input->pos).container;
    local_b8._16_8_ = *(undefined8 *)&(input->pos).index;
    local_a0 = (input->end).container;
    uStack_98._0_4_ = (input->end).index;
    uStack_98._4_4_ = *(undefined4 *)&(input->end).field_0xc;
    local_90 = *(undefined4 *)&(input->pos).container;
    uStack_8c = *(undefined4 *)((long)&(input->pos).container + 4);
    uStack_88 = (input->pos).index;
    uStack_84 = *(undefined4 *)&(input->pos).field_0xc;
    local_b8._0_8_ = input;
    (*(code *)**(undefined8 **)subParser->wrapper)
              (&local_58,subParser->wrapper,subParser->parser,local_b8);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
    NullableValue(&local_80,&local_58);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
    ~NullableValue(&local_58);
    bVar1 = local_80.isSet;
    if (local_80.isSet == true) {
      ((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        *)(local_b8._0_8_ + 8))->index = local_b8._16_4_;
      ((IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
        *)(local_b8._0_8_ + 8))->container = (Reader *)local_b8._8_8_;
      Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>::
      add<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>> *)
                 &local_d8,&local_80.field_1.value);
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
    ~NullableValue(&local_80);
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                      *)local_b8);
  } while (bVar1 != false);
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::releaseAsArray
            ((Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)local_b8,
             (Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
             &local_d8);
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr =
       (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)local_b8._0_8_;
  (__return_storage_ptr__->ptr).field_1.value.size_ = local_b8._8_8_;
  (__return_storage_ptr__->ptr).field_1.value.disposer = (ArrayDisposer *)local_b8._16_8_;
  local_b8._0_8_ =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  local_b8._8_8_ = (Reader *)0x0;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Array
            ((Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)local_b8)
  ;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::dispose
            (&local_d8);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }